

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void * flatcc_json_printer_finalize_dynamic_buffer(flatcc_json_printer_t *ctx,size_t *buffer_size)

{
  char *pcVar1;
  
  (*ctx->flush)(ctx,0);
  pcVar1 = ctx->buf;
  if (buffer_size != (size_t *)0x0) {
    *buffer_size = (long)ctx->p - (long)pcVar1;
  }
  ctx->fp = (void *)0x0;
  ctx->flush = (flatcc_json_printer_flush_f *)0x0;
  ctx->own_buffer = '\0';
  ctx->indent = '\0';
  ctx->unquote = '\0';
  ctx->noenum = '\0';
  ctx->skip_default = '\0';
  ctx->force_default = '\0';
  *(undefined2 *)&ctx->field_0x36 = 0;
  ctx->level = 0;
  ctx->error = 0;
  ctx->pflush = (char *)0x0;
  ctx->p = (char *)0x0;
  ctx->flush_size = 0;
  ctx->total = 0;
  ctx->buf = (char *)0x0;
  ctx->size = 0;
  return pcVar1;
}

Assistant:

void *flatcc_json_printer_finalize_dynamic_buffer(flatcc_json_printer_t *ctx, size_t *buffer_size)
{
    void *buffer;

    buffer = flatcc_json_printer_get_buffer(ctx, buffer_size);
    memset(ctx, 0, sizeof(*ctx));
    return buffer;
}